

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ptexture.h
# Opt level: O3

void Ptex::v2_4::(anonymous_namespace)::ApplyS<unsigned_short,1>
               (PtexSeparableKernel *k,float *result,void *data,int param_4,int nTxChan)

{
  ushort *puVar1;
  ushort *puVar2;
  float fVar3;
  byte bVar4;
  float *pfVar5;
  float *pfVar6;
  long lVar7;
  float *pfVar8;
  int iVar9;
  long lVar10;
  ushort *puVar11;
  int iVar12;
  long lVar13;
  float fVar14;
  
  bVar4 = (k->res).ulog2;
  iVar12 = nTxChan << (bVar4 & 0x1f);
  lVar7 = (long)iVar12 * (long)k->vw;
  if ((int)lVar7 != 0) {
    puVar11 = (ushort *)((long)data + (long)(((k->v << (bVar4 & 0x1f)) + k->u) * nTxChan) * 2);
    puVar1 = puVar11 + lVar7;
    pfVar5 = k->ku;
    pfVar8 = k->kv;
    lVar10 = (long)nTxChan;
    lVar7 = k->uw * lVar10;
    iVar9 = (int)lVar7;
    do {
      fVar14 = (float)*puVar11 * *pfVar5;
      lVar13 = lVar7 * 2;
      pfVar6 = pfVar5;
      if (iVar9 != nTxChan) {
        do {
          puVar2 = puVar11 + lVar10;
          puVar11 = puVar11 + lVar10;
          fVar14 = fVar14 + (float)*puVar2 * pfVar6[1];
          lVar13 = lVar13 + lVar10 * -2;
          pfVar6 = pfVar6 + 1;
        } while (lVar10 * 2 != lVar13);
      }
      fVar3 = *pfVar8;
      pfVar8 = pfVar8 + 1;
      *result = fVar14 * fVar3 + *result;
      puVar11 = puVar11 + lVar10 + (iVar12 - iVar9);
    } while (puVar11 != puVar1);
  }
  return;
}

Assistant:

int u() const { return 1<<(unsigned)ulog2; }